

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathCompMultiplicativeExpr(xmlXPathParserContextPtr ctxt)

{
  xmlChar xVar1;
  int ch1;
  xmlChar *pxVar2;
  byte *pbVar3;
  long lVar4;
  int value;
  
  xmlXPathCompUnaryExpr(ctxt);
  if (ctxt->error != 0) {
    return;
  }
  pbVar3 = ctxt->cur;
  while( true ) {
    if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) break;
    ctxt->cur = pbVar3 + 1;
    pbVar3 = pbVar3 + 1;
  }
  do {
    pxVar2 = ctxt->cur;
    xVar1 = *pxVar2;
    if (xVar1 != '*') {
      if (xVar1 == 'm') {
        if (pxVar2[1] != 'o') {
          return;
        }
        if (pxVar2[2] != 'd') {
          return;
        }
      }
      else {
        if (xVar1 != 'd') {
          return;
        }
        if (pxVar2[1] != 'i') {
          return;
        }
        if (pxVar2[2] != 'v') {
          return;
        }
      }
    }
    ch1 = ctxt->comp->last;
    if (xVar1 == '*') {
      value = 0;
      lVar4 = 1;
LAB_001e867a:
      ctxt->cur = pxVar2 + lVar4;
    }
    else {
      if (xVar1 == 'm') {
        value = 2;
LAB_001e866b:
        lVar4 = 3;
        goto LAB_001e867a;
      }
      value = -1;
      if (xVar1 == 'd') {
        value = 1;
        goto LAB_001e866b;
      }
    }
    pbVar3 = ctxt->cur;
    while( true ) {
      if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar3 + 1;
      pbVar3 = pbVar3 + 1;
    }
    xmlXPathCompUnaryExpr(ctxt);
    if (ctxt->error != 0) {
      return;
    }
    xmlXPathCompExprAdd(ctxt,ch1,ctxt->comp->last,XPATH_OP_MULT,value,0,0,(void *)0x0,(void *)0x0);
    pbVar3 = ctxt->cur;
    while( true ) {
      if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar3 + 1;
      pbVar3 = pbVar3 + 1;
    }
  } while( true );
}

Assistant:

static void
xmlXPathCompMultiplicativeExpr(xmlXPathParserContextPtr ctxt) {
    xmlXPathCompUnaryExpr(ctxt);
    CHECK_ERROR;
    SKIP_BLANKS;
    while ((CUR == '*') ||
           ((CUR == 'd') && (NXT(1) == 'i') && (NXT(2) == 'v')) ||
           ((CUR == 'm') && (NXT(1) == 'o') && (NXT(2) == 'd'))) {
	int op = -1;
	int op1 = ctxt->comp->last;

        if (CUR == '*') {
	    op = 0;
	    NEXT;
	} else if (CUR == 'd') {
	    op = 1;
	    SKIP(3);
	} else if (CUR == 'm') {
	    op = 2;
	    SKIP(3);
	}
	SKIP_BLANKS;
        xmlXPathCompUnaryExpr(ctxt);
	CHECK_ERROR;
	PUSH_BINARY_EXPR(XPATH_OP_MULT, op1, ctxt->comp->last, op, 0);
	SKIP_BLANKS;
    }
}